

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O2

vm_obj_id_t CVmObjTimeZone::create(CVmTimeZone *tz)

{
  vm_obj_id_t obj_id;
  CVmObjTimeZone *this;
  
  obj_id = vm_new_id(0,0,0);
  this = (CVmObjTimeZone *)CVmObject::operator_new(0x10,obj_id);
  CVmObjTimeZone(this,tz);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjTimeZone::create(VMG_ CVmTimeZone *tz)
{
    /* allocate the object ID and create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjTimeZone(vmg_ tz);

    /* return the new ID */
    return id;
}